

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cc
# Opt level: O0

void raptor::anon_unknown_0::log_default_print(LogArgument *args)

{
  FILE *__stream;
  long *plVar1;
  pthread_t pVar2;
  pthread_t *ppVar3;
  char *pcVar4;
  tm *ptVar5;
  size_t sVar6;
  undefined8 *puVar7;
  undefined1 local_b8 [8];
  tm stm;
  time_t timer;
  timeval now;
  char time_buffer [64];
  char *display_file;
  char *last_slash;
  char delimiter;
  LogArgument *args_local;
  
  plVar1 = (long *)__tls_get_addr(&PTR_00137f80);
  if (*plVar1 == 0) {
    pVar2 = pthread_self();
    ppVar3 = (pthread_t *)__tls_get_addr(&PTR_00137f80);
    *ppVar3 = pVar2;
  }
  memset(&now.tv_usec,0,0x40);
  pcVar4 = strrchr(args->file,0x2f);
  if (pcVar4 == (char *)0x0) {
    time_buffer._56_8_ = args->file;
  }
  else {
    time_buffer._56_8_ = pcVar4 + 1;
  }
  gettimeofday((timeval *)&timer,(__timezone_ptr_t)0x0);
  stm.tm_zone = (char *)timer;
  ptVar5 = localtime_r((time_t *)&stm.tm_zone,(tm *)local_b8);
  if (ptVar5 == (tm *)0x0) {
    strcpy((char *)&now.tv_usec,"error:localtime");
  }
  else {
    sVar6 = strftime((char *)&now.tv_usec,0x40,"%F %T",(tm *)local_b8);
    if (sVar6 == 0) {
      strcpy((char *)&now.tv_usec,"error:strftime");
    }
  }
  __stream = _stderr;
  puVar7 = (undefined8 *)__tls_get_addr(&PTR_00137f80);
  fprintf(__stream,"[%s.%03u %5lu %c] %s (%s:%d)\n",&now.tv_usec,now.tv_sec / 1000 & 0xffffffff,
          *puVar7,(ulong)(uint)(int)*(char *)((long)&(anonymous_namespace)::g_level_string +
                                             (long)(int)args->level),args->message,
          time_buffer._56_8_,args->line);
  fflush(_stderr);
  return;
}

Assistant:

void log_default_print(LogArgument* args) {
#ifdef _WIN32
    static __declspec(thread) unsigned long tid = 0;
    if (tid == 0) tid = GetCurrentThreadId();
    constexpr char delimiter = '\\';
#else
    static __thread unsigned long tid = 0;
    if (tid == 0) tid = static_cast<unsigned long>(pthread_self());
    constexpr char delimiter = '/';
#endif
    const char* last_slash = NULL;
    const char* display_file = NULL;
    char time_buffer[64] = { 0 };

    last_slash = strrchr(args->file, delimiter);
    if (last_slash == NULL) {
        display_file = args->file;
    } else {
        display_file = last_slash + 1;
    }

    struct timeval now;
    gettimeofday(&now, nullptr);
    time_t timer = now.tv_sec;

#ifdef _WIN32
    struct tm stm;
    if (localtime_s(&stm, &timer)) {
        strcpy(time_buffer, "error:localtime");
    }
#else
    struct tm stm;
    if (!localtime_r(&timer, &stm)) {
        strcpy(time_buffer, "error:localtime");
    }
#endif
    // "%F %T" 2020-05-10 01:43:06
    else if (0 == strftime(time_buffer, sizeof(time_buffer), "%F %T", &stm)) {
        strcpy(time_buffer, "error:strftime");
    }

    fprintf(stderr,
        "[%s.%03u %5lu %c] %s (%s:%d)\n",
        time_buffer,
        (int)(now.tv_usec / 1000),  // millisecond
        tid,
        g_level_string[static_cast<int>(args->level)],
        args->message,
        display_file, args->line);

    fflush(stderr);
}